

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::TimingCheckArgSyntax::isKind(SyntaxKind kind)

{
  if (((0x35 < kind - DelayedTerminalArg) ||
      ((0x20000200000001U >> ((ulong)(kind - DelayedTerminalArg) & 0x3f) & 1) == 0)) &&
     (kind != TimingCheckEvent)) {
    return false;
  }
  return true;
}

Assistant:

bool TimingCheckArgSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DelayedTerminalArg:
        case SyntaxKind::EmptyTimingCheckArg:
        case SyntaxKind::ExpressionTimingCheckArg:
        case SyntaxKind::TimingCheckEvent:
            return true;
        default:
            return false;
    }
}